

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::addOutputArgumentConversions
          (TParseContext *this,TFunction *function,TIntermAggregate *intermNode)

{
  TIntermediate *pTVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar7;
  TType *pTVar8;
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermSymbol *pTVar10;
  undefined4 extraout_var_04;
  TIntermAggregate *node;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TType *pTVar11;
  TTypeParameters *s;
  TVariable *variable;
  undefined4 extraout_var_08;
  TQualifier *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TIntermSymbol *pTVar12;
  TSourceLoc *pTVar13;
  TIntermTyped *pTVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  int i;
  ulong uVar15;
  TIntermAggregate *local_f8;
  TVariable *local_e8;
  TType paramType;
  long lVar6;
  
  iVar4 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])(intermNode);
  lVar6 = CONCAT44(extraout_var,iVar4);
  uVar15 = 0;
  do {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if ((long)iVar4 <= (long)uVar15) {
      return (TIntermTyped *)intermNode;
    }
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar15 & 0xffffffff);
    pTVar11 = *(TType **)(CONCAT44(extraout_var_00,iVar4) + 8);
    plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18))();
    pTVar8 = (TType *)(**(code **)(*plVar7 + 0xf0))(plVar7);
    bVar2 = TType::operator!=(pTVar11,pTVar8);
    if (bVar2) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar15 & 0xffffffff);
      lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar4) + 8) + 0x50))();
      if ((*(uint *)(lVar9 + 8) & 0x7f) - 0x11 < 2) {
        iVar4 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x20])();
        if (iVar4 == 0) {
          local_e8 = (TVariable *)0x0;
          node = intermNode;
        }
        else {
          iVar4 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])(intermNode);
          local_e8 = makeInternalVariable
                               (this,"tempReturn",(TType *)CONCAT44(extraout_var_02,iVar4));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)(intermNode);
          pTVar10 = TIntermediate::addSymbol
                              (pTVar1,local_e8,(TSourceLoc *)CONCAT44(extraout_var_03,iVar4));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)(intermNode);
          node = (TIntermAggregate *)
                 TIntermediate::addAssign
                           (pTVar1,EOpAssign,&pTVar10->super_TIntermTyped,(TIntermTyped *)intermNode
                            ,(TSourceLoc *)CONCAT44(extraout_var_04,iVar4));
        }
        local_f8 = TIntermediate::makeAggregate
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (TIntermNode *)node);
        uVar15 = 0;
        while( true ) {
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
          if ((long)iVar4 <= (long)uVar15) break;
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar15 & 0xffffffff);
          pTVar11 = *(TType **)(CONCAT44(extraout_var_05,iVar4) + 8);
          plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18))();
          pTVar8 = (TType *)(**(code **)(*plVar7 + 0xf0))(plVar7);
          bVar2 = TType::operator!=(pTVar11,pTVar8);
          if (bVar2) {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function);
            lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_06,iVar4) + 8) + 0x50))();
            if ((*(uint *)(lVar9 + 8) & 0x7f) - 0x11 < 2) {
              TType::TType(&paramType,EbtVoid,EvqTemporary,1,0,0,false);
              iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar15 & 0xffffffff)
              ;
              TType::shallowCopy(&paramType,*(TType **)(CONCAT44(extraout_var_07,iVar4) + 8));
              plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18))
                                         ();
              plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
              cVar3 = (**(code **)(*plVar7 + 0x188))(plVar7);
              if ((cVar3 != '\0') && (paramType.typeParameters == (TTypeParameters *)0x0)) {
                plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18)
                                 )();
                pTVar11 = (TType *)(**(code **)(*plVar7 + 0xf0))(plVar7);
                TType::shallowCopy(&paramType,pTVar11);
                plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18)
                                 )();
                plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
                s = (TTypeParameters *)(**(code **)(*plVar7 + 0xb0))(plVar7);
                TType::copyTypeParameters(&paramType,s);
              }
              variable = makeInternalVariable(this,"tempArg",&paramType);
              iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
              this_00 = (TQualifier *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x50))
                                  ((long *)CONCAT44(extraout_var_08,iVar4));
              TQualifier::makeTemporary(this_00);
              iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar15 & 0xffffffff)
              ;
              lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar4) + 8) + 0x50))();
              if (((*(uint *)(lVar9 + 8) & 0x7f) < 0x14) &&
                 ((0xd0000U >> (*(uint *)(lVar9 + 8) & 0x1f) & 1) != 0)) {
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                           _vptr_TIntermNode)(intermNode);
                pTVar10 = TIntermediate::addSymbol
                                    (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_10,iVar4));
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18)
                                 )();
                pTVar12 = (TIntermSymbol *)(**(code **)(*plVar7 + 0x60))(plVar7);
                pTVar12 = TIntermediate::addSymbol(pTVar1,pTVar12);
                pTVar13 = (TSourceLoc *)
                          (**(code **)**(undefined8 **)(*(long *)(lVar6 + 8) + uVar15 * 8))();
                pTVar14 = TIntermediate::addAssign
                                    (pTVar1,EOpAssign,&pTVar10->super_TIntermTyped,
                                     &pTVar12->super_TIntermTyped,pTVar13);
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                           _vptr_TIntermNode)(intermNode);
                local_f8 = TIntermediate::mergeAggregate
                                     (pTVar1,&pTVar14->super_TIntermNode,(TIntermNode *)local_f8,
                                      (TSourceLoc *)CONCAT44(extraout_var_11,iVar4));
              }
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                         _vptr_TIntermNode)(intermNode);
              pTVar10 = TIntermediate::addSymbol
                                  (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_12,iVar4));
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              pTVar14 = (TIntermTyped *)
                        (**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar15 * 8) + 0x18))();
              pTVar13 = (TSourceLoc *)
                        (**(code **)**(undefined8 **)(*(long *)(lVar6 + 8) + uVar15 * 8))();
              pTVar14 = TIntermediate::addAssign
                                  (pTVar1,EOpAssign,pTVar14,&pTVar10->super_TIntermTyped,pTVar13);
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              pTVar13 = (TSourceLoc *)
                        (**(code **)**(undefined8 **)(*(long *)(lVar6 + 8) + uVar15 * 8))();
              local_f8 = TIntermediate::growAggregate
                                   (pTVar1,(TIntermNode *)local_f8,&pTVar14->super_TIntermNode,
                                    pTVar13);
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                         _vptr_TIntermNode)(intermNode);
              pTVar10 = TIntermediate::addSymbol
                                  (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_13,iVar4));
              *(TIntermSymbol **)(*(long *)(lVar6 + 8) + uVar15 * 8) = pTVar10;
            }
          }
          uVar15 = uVar15 + 1;
        }
        if (local_e8 != (TVariable *)0x0) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)(intermNode);
          pTVar10 = TIntermediate::addSymbol
                              (pTVar1,local_e8,(TSourceLoc *)CONCAT44(extraout_var_14,iVar4));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)(intermNode);
          local_f8 = TIntermediate::growAggregate
                               (pTVar1,(TIntermNode *)local_f8,(TIntermNode *)pTVar10,
                                (TSourceLoc *)CONCAT44(extraout_var_15,iVar4));
        }
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar4 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(intermNode);
        iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                   _vptr_TIntermNode)(intermNode);
        pTVar14 = TIntermediate::setAggregateOperator
                            (pTVar1,(TIntermNode *)local_f8,EOpComma,
                             (TType *)CONCAT44(extraout_var_16,iVar4),
                             (TSourceLoc *)CONCAT44(extraout_var_17,iVar5));
        return pTVar14;
      }
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

TIntermTyped* TParseContext::addOutputArgumentConversions(const TFunction& function, TIntermAggregate& intermNode) const
{
    TIntermSequence& arguments = intermNode.getSequence();

    // Will there be any output conversions?
    bool outputConversions = false;
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType() && function[i].type->getQualifier().isParamOutput()) {
            outputConversions = true;
            break;
        }
    }

    if (! outputConversions)
        return &intermNode;

    // Setup for the new tree, if needed:
    //
    // Output conversions need a different tree topology.
    // Out-qualified arguments need a temporary of the correct type, with the call
    // followed by an assignment of the temporary to the original argument:
    //     void: function(arg, ...)  ->        (          function(tempArg, ...), arg = tempArg, ...)
    //     ret = function(arg, ...)  ->  ret = (tempRet = function(tempArg, ...), arg = tempArg, ..., tempRet)
    // Where the "tempArg" type needs no conversion as an argument, but will convert on assignment.
    TIntermTyped* conversionTree = nullptr;
    TVariable* tempRet = nullptr;
    if (intermNode.getBasicType() != EbtVoid) {
        // do the "tempRet = function(...), " bit from above
        tempRet = makeInternalVariable("tempReturn", intermNode.getType());
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.addAssign(EOpAssign, tempRetNode, &intermNode, intermNode.getLoc());
    } else
        conversionTree = &intermNode;

    conversionTree = intermediate.makeAggregate(conversionTree);

    // Process each argument's conversion
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType()) {
            if (function[i].type->getQualifier().isParamOutput()) {
                // Out-qualified arguments need to use the topology set up above.
                // do the " ...(tempArg, ...), arg = tempArg" bit from above
                TType paramType;
                paramType.shallowCopy(*function[i].type);
                if (arguments[i]->getAsTyped()->getType().isParameterized() &&
                    !paramType.isParameterized()) {
                    paramType.shallowCopy(arguments[i]->getAsTyped()->getType());
                    paramType.copyTypeParameters(*arguments[i]->getAsTyped()->getType().getTypeParameters());
                }
                TVariable* tempArg = makeInternalVariable("tempArg", paramType);
                tempArg->getWritableType().getQualifier().makeTemporary();
                if (function[i].type->getQualifier().isParamInput()) {
                    // If the parameter is also an input, copy-in.
                    TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                    TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, tempArgNode, intermediate.addSymbol(*arguments[i]->getAsTyped()->getAsSymbolNode()), arguments[i]->getLoc());
                    conversionTree = intermediate.mergeAggregate(tempAssign, conversionTree, intermNode.getLoc());
                }

                TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, arguments[i]->getAsTyped(), tempArgNode, arguments[i]->getLoc());
                conversionTree = intermediate.growAggregate(conversionTree, tempAssign, arguments[i]->getLoc());
                // replace the argument with another node for the same tempArg variable
                arguments[i] = intermediate.addSymbol(*tempArg, intermNode.getLoc());
            }
        }
    }

    // Finalize the tree topology (see bigger comment above).
    if (tempRet) {
        // do the "..., tempRet" bit from above
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.growAggregate(conversionTree, tempRetNode, intermNode.getLoc());
    }
    conversionTree = intermediate.setAggregateOperator(conversionTree, EOpComma, intermNode.getType(), intermNode.getLoc());

    return conversionTree;
}